

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lys_node * lyd_new_find_schema(lyd_node *parent,lys_module *module,int rpc_output)

{
  lys_node *plVar1;
  lys_node **pplVar2;
  LYS_NODE LVar3;
  
  if (parent == (lyd_node *)0x0) {
    pplVar2 = &module->data;
  }
  else {
    if ((parent->schema == (lys_node *)0x0) ||
       (plVar1 = parent->schema->child, plVar1 == (lys_node *)0x0)) {
      return (lys_node *)0x0;
    }
    LVar3 = plVar1->nodetype;
    if (LVar3 == (uint)(rpc_output == 0) * 0x200 + LYS_INPUT) {
      plVar1 = plVar1->next;
      if (plVar1 == (lys_node *)0x0) {
        return (lys_node *)0x0;
      }
      LVar3 = plVar1->nodetype;
    }
    if (LVar3 != (uint)(rpc_output != 0) * 0x200 + LYS_INPUT) {
      return plVar1;
    }
    pplVar2 = &plVar1->child;
  }
  return *pplVar2;
}

Assistant:

static struct lys_node *
lyd_new_find_schema(struct lyd_node *parent, const struct lys_module *module, int rpc_output)
{
    struct lys_node *siblings;

    if (!parent) {
        siblings = module->data;
    } else {
        if (!parent->schema) {
            return NULL;
        }
        siblings = parent->schema->child;
        if (siblings && (siblings->nodetype == (rpc_output ? LYS_INPUT : LYS_OUTPUT))) {
            siblings = siblings->next;
        }
        if (siblings && (siblings->nodetype == (rpc_output ? LYS_OUTPUT : LYS_INPUT))) {
            siblings = siblings->child;
        }
    }

    return siblings;
}